

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalDatatypeValidator.cpp
# Opt level: O1

XMLCh * __thiscall
xercesc_4_0::DecimalDatatypeValidator::getCanonicalRepresentation
          (DecimalDatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  short *psVar1;
  CanRepGroup CVar2;
  int iVar3;
  XMLCh *pXVar4;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  size_t __n;
  
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
             super_DatatypeValidator.fMemoryManager;
  }
  if ((int)CONCAT71(in_register_00000009,toValidate) != 0) {
    (*(this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
      super_DatatypeValidator.super_XSerializable._vptr_XSerializable[0x11])
              (this,rawData,0,0,memMgr);
  }
  CVar2 = DatatypeValidatorFactory::getCanRepGroup((DatatypeValidator *)this);
  if (CVar2 - Decimal_Derived_signed < 3) {
    pXVar4 = XMLBigInteger::getCanonicalRepresentation(rawData,memMgr,CVar2 == Decimal_Derived_npi);
    return pXVar4;
  }
  if (CVar2 == Decimal) {
    pXVar4 = XMLBigDecimal::getCanonicalRepresentation(rawData,memMgr);
    return pXVar4;
  }
  if (rawData != (XMLCh *)0x0) {
    __n = 0;
    do {
      psVar1 = (short *)((long)rawData + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar3 = (*memMgr->_vptr_MemoryManager[3])(memMgr,__n);
    pXVar4 = (XMLCh *)memcpy((void *)CONCAT44(extraout_var,iVar3),rawData,__n);
    return pXVar4;
  }
  return (XMLCh *)0x0;
}

Assistant:

const XMLCh* DecimalDatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                                 ,      MemoryManager* const memMgr
                                                                 ,      bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    DecimalDatatypeValidator* temp = (DecimalDatatypeValidator*) this;

    if (toValidate)
    {
        try
        {
            temp->checkContent(rawData, 0, false, toUse);
        }
        catch (...)
        {
            return 0;
        }
    }

    // XMLBigInteger::getCanonicalRepresentation and
    // XMLBigDecimal::getCanonicalRepresentation will handle exceptional cases
    XMLCanRepGroup::CanRepGroup dvType = DatatypeValidatorFactory::getCanRepGroup(temp);

    if ((dvType == XMLCanRepGroup::Decimal_Derived_signed)   ||
        (dvType == XMLCanRepGroup::Decimal_Derived_unsigned) ||
        (dvType == XMLCanRepGroup::Decimal_Derived_npi)        )
    {
        return XMLBigInteger::getCanonicalRepresentation(rawData, toUse, dvType == XMLCanRepGroup::Decimal_Derived_npi);
    }
    else if (dvType == XMLCanRepGroup::Decimal)
    {
        return XMLBigDecimal::getCanonicalRepresentation(rawData, toUse);
    }
    else //in case?
    {
        return XMLString::replicate(rawData, toUse);
    }

}